

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
          (ArgBuilder *this,_func_void_ConfigData_ptr_bool *binaryFunction,string *placeholder)

{
  BoundBinaryFunction<Catch::ConfigData,_bool> *this_00;
  BoundArgFunction<Catch::ConfigData> local_28;
  string *local_20;
  string *placeholder_local;
  _func_void_ConfigData_ptr_bool *binaryFunction_local;
  ArgBuilder *this_local;
  
  local_20 = placeholder;
  placeholder_local = (string *)binaryFunction;
  binaryFunction_local = (_func_void_ConfigData_ptr_bool *)this;
  this_00 = (BoundBinaryFunction<Catch::ConfigData,_bool> *)operator_new(0x10);
  Detail::BoundBinaryFunction<Catch::ConfigData,_bool>::BoundBinaryFunction
            (this_00,(_func_void_ConfigData_ptr_bool *)placeholder_local);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&local_28,(IArgFunction<Catch::ConfigData> *)this_00);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_28);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(&local_28);
  std::__cxx11::string::operator=
            ((string *)&(this->m_arg->super_CommonArgProperties<Catch::ConfigData>).placeholder,
             (string *)local_20);
  return;
}

Assistant:

void bind( void (* binaryFunction)( C&, T ), std::string const& placeholder ) {
                m_arg->boundField = new Detail::BoundBinaryFunction<C, T>( binaryFunction );
                m_arg->placeholder = placeholder;
            }